

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

int32_t tnt_schema_stoiid(tnt_schema *schema_obj,uint32_t sid,char *name,uint32_t name_len)

{
  mh_assoc_t *h;
  void *pvVar1;
  long *plVar2;
  mh_int_t mVar3;
  void *arg;
  undefined1 local_48 [8];
  assoc_key space_key;
  assoc_key index_key;
  uint32_t sid_local;
  
  local_48 = (undefined1  [8])&index_key.field_0xc;
  h = schema_obj->space_hash;
  space_key.id._0_4_ = 4;
  index_key._12_4_ = sid;
  mVar3 = mh_assoc_find(h,(assoc_key *)local_48,name);
  if (mVar3 != h->n_buckets) {
    pvVar1 = h->p[mVar3]->data;
    space_key._8_8_ = name;
    index_key.id._0_4_ = name_len;
    mVar3 = mh_assoc_find(*(mh_assoc_t **)((long)pvVar1 + 0x10),(assoc_key *)&space_key.id_len,arg);
    plVar2 = *(long **)((long)pvVar1 + 0x10);
    if (mVar3 != *(mh_int_t *)(plVar2 + 2)) {
      return *(int32_t *)(*(long *)(*(long *)(*plVar2 + (ulong)mVar3 * 8) + 0x10) + 0xc);
    }
  }
  return -1;
}

Assistant:

int32_t tnt_schema_stoiid(struct tnt_schema *schema_obj, uint32_t sid,
			  const char *name, uint32_t name_len) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	struct assoc_key space_key = {(void *)&sid, sizeof(uint32_t)};
	mh_int_t space_slot = mh_assoc_find(schema, &space_key, NULL);
	if (space_slot == mh_end(schema))
		return -1;
	const struct tnt_schema_sval *space =
		(*mh_assoc_node(schema, space_slot))->data;
	struct assoc_key index_key = {name, name_len};
	mh_int_t index_slot = mh_assoc_find(space->index, &index_key, NULL);
	if (index_slot == mh_end(space->index))
		return -1;
	const struct tnt_schema_ival *index =
		(*mh_assoc_node(space->index, index_slot))->data;
	return index->number;
}